

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O0

void __thiscall
MetricsDiscovery::MDHelper::PrintMetricValues
          (MDHelper *this,ostream *os,string *name,uint32_t numResults,
          vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
          *results,vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                   *maxValues,
          vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
          *ioInfoValues)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ostream *poVar7;
  uint in_ECX;
  string *in_RDX;
  MDHelper *in_RSI;
  long in_RDI;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  *in_R8;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  *in_R9;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  *in_stack_00000008;
  uint32_t i_2;
  uint32_t ioInfoCount;
  uint32_t i_1;
  uint32_t i;
  uint32_t result;
  uint32_t resultsCount;
  uint32_t infoCount;
  uint32_t metricsCount;
  MDHelper *in_stack_ffffffffffffff90;
  MDHelper *in_stack_ffffffffffffff98;
  MDHelper *in_stack_ffffffffffffffa0;
  uint local_50;
  uint local_48;
  uint local_44;
  uint local_40;
  
  if (((((*(byte *)(in_RDI + 0x20) & 1) != 0) && (*(long *)(in_RDI + 0x48) != 0)) &&
      (*(long *)(in_RDI + 0x50) != 0)) && (uVar5 = std::ios::good(), (uVar5 & 1) != 0)) {
    lVar6 = (**(code **)(**(long **)(in_RDI + 0x50) + 0x10))();
    uVar1 = *(uint *)(lVar6 + 0x20);
    lVar6 = (**(code **)(**(long **)(in_RDI + 0x50) + 0x10))();
    uVar2 = *(uint *)(lVar6 + 0x24);
    iVar4 = uVar1 + uVar2;
    for (local_40 = 0; local_40 < in_ECX; local_40 = local_40 + 1) {
      poVar7 = std::operator<<((ostream *)in_RSI,in_RDX);
      std::operator<<(poVar7,",");
      for (local_44 = 0; local_44 < uVar1; local_44 = local_44 + 1) {
        in_stack_ffffffffffffffa0 = in_RSI;
        std::
        vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
        ::operator[](in_R8,(ulong)(iVar4 * local_40 + local_44));
        PrintValue(in_stack_ffffffffffffffa0,(ostream *)in_stack_ffffffffffffff98,
                   (TTypedValueLatest *)in_stack_ffffffffffffff90);
        if ((*(byte *)(in_RDI + 0x22) & 1) != 0) {
          in_stack_ffffffffffffff98 = in_RSI;
          std::
          vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
          ::operator[](in_R9,(ulong)(uVar1 * local_40 + local_44));
          PrintValue(in_stack_ffffffffffffffa0,(ostream *)in_stack_ffffffffffffff98,
                     (TTypedValueLatest *)in_stack_ffffffffffffff90);
        }
      }
      std::operator<<((ostream *)in_RSI,",");
      for (local_48 = 0; local_48 < uVar2; local_48 = local_48 + 1) {
        in_stack_ffffffffffffff90 = in_RSI;
        std::
        vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
        ::operator[](in_R8,(ulong)(iVar4 * local_40 + uVar1 + local_48));
        PrintValue(in_stack_ffffffffffffffa0,(ostream *)in_stack_ffffffffffffff98,
                   (TTypedValueLatest *)in_stack_ffffffffffffff90);
      }
      if ((*(uint *)(in_RDI + 0x24) & 1) != 0) {
        std::operator<<((ostream *)in_RSI,",");
        lVar6 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))();
        uVar3 = *(uint *)(lVar6 + 0x18);
        for (local_50 = 0; local_50 < uVar3; local_50 = local_50 + 1) {
          std::
          vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
          ::operator[](in_stack_00000008,(ulong)local_50);
          PrintValue(in_stack_ffffffffffffffa0,(ostream *)in_stack_ffffffffffffff98,
                     (TTypedValueLatest *)in_stack_ffffffffffffff90);
        }
      }
      std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void MDHelper::PrintMetricValues(
    std::ostream& os,
    const std::string& name,
    const uint32_t numResults,
    const std::vector<TTypedValueLatest>& results,
    const std::vector<TTypedValueLatest>& maxValues,
    const std::vector<TTypedValueLatest>& ioInfoValues )
{
    if( !m_Initialized || !m_ConcurrentGroup || !m_MetricSet || !os.good() )
    {
        DebugPrint("Can't PrintMetricValues!\n");
        return;
    }

    const uint32_t metricsCount = m_MetricSet->GetParams()->MetricsCount;
    const uint32_t infoCount = m_MetricSet->GetParams()->InformationCount;

    const uint32_t resultsCount = metricsCount + infoCount;

    for( uint32_t result = 0; result < numResults; result++ )
    {
        os << name << ",";

        for( uint32_t i = 0; i < metricsCount; i++ )
        {
            PrintValue( os, results[ resultsCount * result + i ] );
            if( m_IncludeMaxValues )
            {
                PrintValue( os, maxValues[ metricsCount * result + i ] );
            }
        }

        os << ",";

        for( uint32_t i = 0; i < infoCount; i++ )
        {
            PrintValue( os, results[ resultsCount * result + metricsCount + i ] );
        }

        if( m_APIMask & API_TYPE_IOSTREAM )
        {
            os << ",";

            const uint32_t ioInfoCount =
                m_ConcurrentGroup->GetParams()->IoMeasurementInformationCount;
            for( uint32_t i = 0; i < ioInfoCount; i++ )
            {
                PrintValue( os, ioInfoValues[ i ] );
            }
        }

        os << std::endl;
    }
}